

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t * archive_acl_to_text_w(archive_acl *acl,ssize_t *text_len,wchar_t flags,archive *a)

{
  int iVar1;
  wchar_t want_type;
  uint uVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t *__s;
  int *piVar5;
  size_t sVar6;
  char *msg;
  archive_acl_entry *paVar7;
  wchar_t *local_58;
  int local_50;
  wchar_t local_4c;
  size_t *local_48;
  ssize_t local_40;
  wchar_t *wname;
  
  want_type = archive_acl_text_want_type(acl,flags);
  if (want_type != L'\0') {
    if (want_type == L'̀') {
      flags = flags | 2;
    }
    local_40 = archive_acl_text_len(acl,want_type,flags,L'\x01',a,(archive_string_conv *)0x0);
    if (local_40 == 0) {
      return (wchar_t *)0x0;
    }
    local_4c = L',';
    if ((flags & 8U) == 0) {
      local_4c = L'\n';
    }
    __s = (wchar_t *)malloc(local_40 * 4);
    local_58 = __s;
    if (__s == (wchar_t *)0x0) {
      piVar5 = __errno_location();
      if (*piVar5 == 0xc) {
        msg = "No memory";
LAB_00180148:
        __archive_errx(1,msg);
      }
    }
    else {
      local_50 = 0;
      local_48 = (size_t *)text_len;
      if (((uint)want_type >> 8 & 1) != 0) {
        append_entry_w(&local_58,(wchar_t *)0x0,L'Ā',L'✒',flags,(wchar_t *)0x0,acl->mode & 0x1c0,
                       L'\xffffffff');
        wVar4 = local_4c;
        *local_58 = local_4c;
        local_58 = local_58 + 1;
        append_entry_w(&local_58,(wchar_t *)0x0,L'Ā',L'✔',flags,(wchar_t *)0x0,acl->mode & 0x38,
                       L'\xffffffff');
        *local_58 = wVar4;
        local_58 = local_58 + 1;
        append_entry_w(&local_58,(wchar_t *)0x0,L'Ā',L'✖',flags,(wchar_t *)0x0,acl->mode & 7,
                       L'\xffffffff');
        local_50 = 3;
      }
      paVar7 = (archive_acl_entry *)&acl->acl_head;
      do {
        while( true ) {
          do {
            paVar7 = paVar7->next;
            if (paVar7 == (archive_acl_entry *)0x0) {
              *local_58 = L'\0';
              sVar6 = wcslen(__s);
              if ((long)sVar6 < local_40) {
                if (local_48 == (size_t *)0x0) {
                  return __s;
                }
                *local_48 = sVar6;
                return __s;
              }
              msg = "Buffer overrun";
              goto LAB_00180148;
            }
            wVar4 = paVar7->type;
          } while (((wVar4 & want_type) == 0) ||
                  (((wVar4 == L'Ā' && (uVar2 = paVar7->tag + L'\xffffd8ee', uVar2 < 5)) &&
                   ((0x15U >> (uVar2 & 0x1f) & 1) != 0))));
          wVar3 = archive_mstring_get_wcs(a,&paVar7->name,&wname);
          iVar1 = local_50;
          if (wVar3 != L'\0') break;
          piVar5 = anon_var_dwarf_d5631;
          if (wVar4 != L'Ȁ') {
            piVar5 = (wchar_t *)0x0;
          }
          if ((flags & 2U) == 0) {
            piVar5 = (wchar_t *)0x0;
          }
          if (local_50 != 0) {
            *local_58 = local_4c;
            local_58 = local_58 + 1;
          }
          wVar4 = L'\xffffffff';
          if ((flags & 1U) != 0) {
            wVar4 = paVar7->id;
          }
          append_entry_w(&local_58,piVar5,paVar7->type,paVar7->tag,flags,wname,paVar7->permset,wVar4
                        );
          local_50 = iVar1 + 1;
        }
      } while ((L'\xffffffff' < wVar3) || (piVar5 = __errno_location(), *piVar5 != 0xc));
    }
  }
  return (wchar_t *)0x0;
}

Assistant:

wchar_t *
archive_acl_to_text_w(struct archive_acl *acl, ssize_t *text_len, int flags,
    struct archive *a)
{
	int count;
	ssize_t length;
	size_t len;
	const wchar_t *wname;
	const wchar_t *prefix;
	wchar_t separator;
	struct archive_acl_entry *ap;
	int id, r, want_type;
	wchar_t *wp, *ws;

	want_type = archive_acl_text_want_type(acl, flags);

	/* Both NFSv4 and POSIX.1 types found */
	if (want_type == 0)
		return (NULL);

	if (want_type == ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)
		flags |= ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT;

	length = archive_acl_text_len(acl, want_type, flags, 1, a, NULL);

	if (length == 0)
		return (NULL);

	if (flags & ARCHIVE_ENTRY_ACL_STYLE_SEPARATOR_COMMA)
		separator = L',';
	else
		separator = L'\n';

	/* Now, allocate the string and actually populate it. */
	wp = ws = (wchar_t *)malloc(length * sizeof(wchar_t));
	if (wp == NULL) {
		if (errno == ENOMEM)
			__archive_errx(1, "No memory");
		return (NULL);
	}
	count = 0;

	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_USER_OBJ, flags, NULL,
		    acl->mode & 0700, -1);
		*wp++ = separator;
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_GROUP_OBJ, flags, NULL,
		    acl->mode & 0070, -1);
		*wp++ = separator;
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_OTHER, flags, NULL,
		    acl->mode & 0007, -1);
		count += 3;
	}

	for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
		if ((ap->type & want_type) == 0)
			continue;
		/*
		 * Filemode-mapping ACL entries are stored exclusively in
		 * ap->mode so they should not be in the list
		 */
		if ((ap->type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS)
		    && (ap->tag == ARCHIVE_ENTRY_ACL_USER_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_OTHER))
			continue;
		if (ap->type == ARCHIVE_ENTRY_ACL_TYPE_DEFAULT &&
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) != 0)
			prefix = L"default:";
		else
			prefix = NULL;
		r = archive_mstring_get_wcs(a, &ap->name, &wname);
		if (r == 0) {
			if (count > 0)
				*wp++ = separator;
			if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
				id = ap->id;
			else
				id = -1;
			append_entry_w(&wp, prefix, ap->type, ap->tag, flags,
			    wname, ap->permset, id);
			count++;
		} else if (r < 0 && errno == ENOMEM)
			return (NULL);
	}

	/* Add terminating character */
	*wp++ = L'\0';

	len = wcslen(ws);

	if ((ssize_t)len > (length - 1))
		__archive_errx(1, "Buffer overrun");

	if (text_len != NULL)
		*text_len = len;

	return (ws);
}